

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O3

uint TTA::Merge(uint u,uint v)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  
  puVar5 = next_;
  puVar4 = rtable_;
  uVar1 = rtable_[u];
  uVar2 = rtable_[v];
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    for (; uVar6 = uVar2, uVar7 = uVar1, uVar3 != 0xffffffff; uVar3 = puVar5[uVar3]) {
      puVar4[uVar3] = uVar1;
    }
  }
  else {
    uVar3 = uVar1;
    if (uVar1 <= uVar2) {
      return uVar1;
    }
    for (; uVar6 = uVar1, uVar7 = uVar2, uVar3 != 0xffffffff; uVar3 = puVar5[uVar3]) {
      puVar4[uVar3] = uVar2;
    }
  }
  puVar4 = tail_;
  puVar5[tail_[uVar7]] = uVar6;
  puVar4[uVar7] = puVar4[uVar6];
  return uVar7;
}

Assistant:

static unsigned Merge(unsigned u, unsigned v)
    {
        // FindRoot(u);
        u = rtable_[u];
        // FindRoot(v);
        v = rtable_[v];

        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                rtable_[i] = u;
                i = next_[i];
            }
            next_[tail_[u]] = v;
            tail_[u] = tail_[v];
            return u;
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                rtable_[i] = v;
                i = next_[i];
            }
            next_[tail_[v]] = u;
            tail_[v] = tail_[u];
            return v;
        }

        return u;  // equal to v
    }